

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O1

void __thiscall jrtplib::RTPUDPv4Transmitter::GetLocalIPList_DNS(RTPUDPv4Transmitter *this)

{
  size_t *psVar1;
  hostent *phVar2;
  _List_node_base *p_Var3;
  byte bVar4;
  long lVar5;
  int iVar6;
  bool bVar7;
  uint32_t ip;
  uint uVar8;
  char name [1024];
  char acStack_438 [1023];
  undefined1 local_39;
  
  gethostname(acStack_438,0x3ff);
  local_39 = 0;
  phVar2 = gethostbyname(acStack_438);
  if (phVar2 != (hostent *)0x0) {
    iVar6 = 0;
    bVar7 = false;
    do {
      if (phVar2->h_addr_list[iVar6] == (char *)0x0) {
        bVar7 = true;
      }
      else {
        lVar5 = 0;
        bVar4 = 0x18;
        uVar8 = 0;
        do {
          uVar8 = uVar8 | (uint)(byte)phVar2->h_addr_list[iVar6][lVar5] << (bVar4 & 0x1f);
          lVar5 = lVar5 + 1;
          bVar4 = bVar4 - 8;
        } while (lVar5 != 4);
        p_Var3 = (_List_node_base *)operator_new(0x18);
        *(uint *)&p_Var3[1]._M_next = uVar8;
        std::__detail::_List_node_base::_M_hook(p_Var3);
        psVar1 = &(this->localIPs).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        iVar6 = iVar6 + 1;
      }
    } while (!bVar7);
  }
  return;
}

Assistant:

void RTPUDPv4Transmitter::GetLocalIPList_DNS()
{
	struct hostent *he;
	char name[1024];
	bool done;
	int i,j;

	gethostname(name,1023);
	name[1023] = 0;
	he = gethostbyname(name);
	if (he == 0)
		return;
	
	i = 0;
	done = false;
	while (!done)
	{
		if (he->h_addr_list[i] == NULL)
			done = true;
		else
		{
			uint32_t ip = 0;

			for (j = 0 ; j < 4 ; j++)
				ip |= ((uint32_t)((unsigned char)he->h_addr_list[i][j])<<((3-j)*8));
			localIPs.push_back(ip);
			i++;
		}
	}
}